

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O2

void __thiscall entities::Label::Label(Label *this,Chunk *chunk,uint tileIndex,Label *rhs)

{
  LodRenderer *pLVar1;
  repr coords;
  
  Entity::Entity(&this->super_Entity,chunk,tileIndex);
  (this->super_Entity)._vptr_Entity = (_func_int **)&PTR__Label_0026d2d0;
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Label_0026d308;
  sf::Text::Text(&this->text_,&rhs->text_);
  spdlog::debug<char[38]>((char (*) [38])"Label entity (copy) has been created.");
  pLVar1 = Chunk::getLodRenderer(chunk);
  if (pLVar1 != (LodRenderer *)0x0) {
    pLVar1 = Chunk::getLodRenderer(chunk);
    coords = Chunk::getCoords(chunk);
    LodRenderer::addDecoration(pLVar1,coords,tileIndex,&this->super_Drawable);
  }
  return;
}

Assistant:

Label::Label(Chunk& chunk, unsigned int tileIndex, const Label& rhs) :
    Entity(chunk, tileIndex),
    text_(rhs.text_) {

    spdlog::debug("Label entity (copy) has been created.");
    if (chunk.getLodRenderer() != nullptr) {
        chunk.getLodRenderer()->addDecoration(chunk.getCoords(), tileIndex, this);
    }
}